

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingUtility.h
# Opt level: O2

void __thiscall
BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::SetUp
          (BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *this)

{
  undefined8 *puVar1;
  
  BaseFixture::SetUp(&this->super_BaseFixture);
  pica::ParticleTypes::numTypes = 1;
  std::vector<pica::ParticleType,_std::allocator<pica::ParticleType>_>::resize
            ((vector<pica::ParticleType,_std::allocator<pica::ParticleType>_> *)
             &pica::ParticleTypes::typesVector,1);
  puVar1 = pica::ParticleTypes::typesVector;
  pica::ParticleTypes::types = pica::ParticleTypes::typesVector;
  *pica::ParticleTypes::typesVector = 0x3a520b016873bbd3;
  puVar1[1] = 0xbe0080f172b1f37d;
  return;
}

Assistant:

virtual void SetUp()
    {
        BaseFixture::SetUp();

        pica::ParticleTypes::numTypes = 1;
        pica::ParticleTypes::typesVector.resize(1);
        pica::ParticleTypes::types = &pica::ParticleTypes::typesVector[0];
        pica::ParticleTypes::typesVector[0].mass = pica::Constants<pica::MassType>::electronMass();
        pica::ParticleTypes::typesVector[0].charge = pica::Constants<pica::ChargeType>::electronCharge();
    }